

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O2

RealType __thiscall OpenMD::Thermo::getTaggedAtomPairDistance(Thermo *this)

{
  Globals *pGVar1;
  Snapshot *this_00;
  undefined8 uVar2;
  StuntDouble *this_01;
  StuntDouble *this_02;
  RealType RVar3;
  Vector3d rab;
  Vector3d pos2;
  Vector3d pos1;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  pGVar1 = this->info_->simParams_;
  RVar3 = 0.0;
  if ((((pGVar1->TaggedAtomPair).super_ParameterBase.empty_ == false) &&
      ((pGVar1->PrintTaggedPairDistance).super_ParameterBase.empty_ == false)) &&
     ((pGVar1->PrintTaggedPairDistance).super_ParameterBase.field_0x2b == '\x01')) {
    this_00 = this->info_->sman_->currentSnapshot_;
    uVar2 = *(undefined8 *)&(pGVar1->TaggedAtomPair).super_ParameterBase.field_0x2c;
    Vector<double,_3U>::Vector(&local_48);
    Vector<double,_3U>::Vector(&local_60);
    Vector<double,_3U>::Vector(&local_78);
    this_01 = SimInfo::getIOIndexToIntegrableObject(this->info_,(int)uVar2);
    this_02 = SimInfo::getIOIndexToIntegrableObject(this->info_,(int)((ulong)uVar2 >> 0x20));
    StuntDouble::getPos((Vector3d *)&local_90,this_01);
    Vector<double,_3U>::operator=(&local_48,&local_90);
    StuntDouble::getPos((Vector3d *)&local_90,this_02);
    Vector<double,_3U>::operator=(&local_60,&local_90);
    operator-(&local_90,&local_60,&local_48);
    Vector3<double>::operator=((Vector3<double> *)&local_78,&local_90);
    Snapshot::wrapVector(this_00,(Vector3d *)&local_78);
    RVar3 = Vector<double,_3U>::length(&local_78);
  }
  return RVar3;
}

Assistant:

RealType Thermo::getTaggedAtomPairDistance() {
    Snapshot* currSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
    Globals* simParams     = info_->getSimParams();

    if (simParams->haveTaggedAtomPair() &&
        simParams->havePrintTaggedPairDistance()) {
      if (simParams->getPrintTaggedPairDistance()) {
        pair<int, int> tap = simParams->getTaggedAtomPair();
        Vector3d pos1, pos2, rab;

#ifdef IS_MPI
        int mol1 = info_->getGlobalMolMembership(tap.first);
        int mol2 = info_->getGlobalMolMembership(tap.second);

        int proc1 = info_->getMolToProc(mol1);
        int proc2 = info_->getMolToProc(mol2);

        RealType data[3];
        if (proc1 == worldRank) {
          StuntDouble* sd1 = info_->getIOIndexToIntegrableObject(tap.first);
          pos1             = sd1->getPos();
          data[0]          = pos1.x();
          data[1]          = pos1.y();
          data[2]          = pos1.z();
          MPI_Bcast(data, 3, MPI_REALTYPE, proc1, MPI_COMM_WORLD);
        } else {
          MPI_Bcast(data, 3, MPI_REALTYPE, proc1, MPI_COMM_WORLD);
          pos1 = Vector3d(data);
        }

        if (proc2 == worldRank) {
          StuntDouble* sd2 = info_->getIOIndexToIntegrableObject(tap.second);
          pos2             = sd2->getPos();
          data[0]          = pos2.x();
          data[1]          = pos2.y();
          data[2]          = pos2.z();
          MPI_Bcast(data, 3, MPI_REALTYPE, proc2, MPI_COMM_WORLD);
        } else {
          MPI_Bcast(data, 3, MPI_REALTYPE, proc2, MPI_COMM_WORLD);
          pos2 = Vector3d(data);
        }
#else
        StuntDouble* at1 = info_->getIOIndexToIntegrableObject(tap.first);
        StuntDouble* at2 = info_->getIOIndexToIntegrableObject(tap.second);
        pos1             = at1->getPos();
        pos2             = at2->getPos();
#endif
        rab = pos2 - pos1;
        currSnapshot->wrapVector(rab);
        return rab.length();
      }
      return 0.0;
    }
    return 0.0;
  }